

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanLogicalDevice.cpp
# Opt level: O0

VkResult __thiscall
VulkanUtilities::VulkanLogicalDevice::ResetFence(VulkanLogicalDevice *this,VkFence fence)

{
  Char *Message;
  undefined1 local_40 [8];
  string msg;
  VkFence pVStack_18;
  VkResult err;
  VkFence fence_local;
  VulkanLogicalDevice *this_local;
  
  pVStack_18 = fence;
  fence_local = (VkFence)this;
  msg.field_2._12_4_ = (*vkResetFences)(this->m_VkDevice,1,&stack0xffffffffffffffe8);
  if (msg.field_2._12_4_ != VK_SUCCESS) {
    Diligent::FormatString<char[23]>((string *)local_40,(char (*) [23])"vkResetFences() failed");
    Message = (Char *)std::__cxx11::string::c_str();
    Diligent::DebugAssertionFailed
              (Message,"ResetFence",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanUtilities/VulkanLogicalDevice.cpp"
               ,0x28a);
    std::__cxx11::string::~string((string *)local_40);
  }
  return msg.field_2._12_4_;
}

Assistant:

VkResult VulkanLogicalDevice::ResetFence(VkFence fence) const
{
    VkResult err = vkResetFences(m_VkDevice, 1, &fence);
    DEV_CHECK_ERR(err == VK_SUCCESS, "vkResetFences() failed");
    return err;
}